

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall QLocale::amText(QString *__return_storage_ptr__,QLocale *this)

{
  QLocaleData *pQVar1;
  Data *pDVar2;
  QSystemLocale *pQVar3;
  ulong size;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    local_50 = 2;
    (*pQVar3->_vptr_QSystemLocale[2])(&local_40,pQVar3,0x1b);
    ::QVariant::toString(__return_storage_ptr__,&local_40);
    ::QVariant::~QVariant(&local_40);
    ::QVariant::~QVariant((QVariant *)&local_68);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_00315e52;
    pDVar2 = (__return_storage_ptr__->d).d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar1 = ((this->d).d.ptr)->m_data;
  size = (ulong)pQVar1->m_anteMeridiem_size;
  if (size == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QString::fromRawData
              ((QChar *)(
                        L"AMvm.a.gANe paraditesጥዋትصde la mañanaicheheavoАМsárúwáI bikɛ̂glàuluchelopamilauभोरफुंprijepodneприје поднеA.M.пр.об.နံနက်上午a.\xa0m.Zdat azalب.نᏌᎾᎴUhr vörmiddaachsa.m.dop.सवेरidiɓaསྔ་ཆ་KI𐐈𐐣𐑨𐑥atmŋdikíkírígap.matinsubaka𞤀𞤎LEEBIπ.μ.MambiaSafiyade.f.h.N’ụtụtụip.ante midír.n.午前Isukn tufatkaroonĨyakwakyaاے ایمये एमKirokoसकाळींsokallim오전AdduhaBNmanáтаңкыTOOກ່ອນທ່ຽງpriekšpusdienāntɔ́ngɔ́priešpietdopołdnjaDindaODmoiesпретпл.utukowichishuMuhiPGএ এমƐnkakɛnyáRŨү.ө.ᠦ᠂ ᠥcommeǁgoagasपूर्वाह्नmbaʼámbaʼmbaꞌmbaꞌFọ mọ́ninߛiđitbeaivetibf.m.RWWDӕмбисбоны размӕغ.م.قبل\x200cازظهرda manhãankstāinanਪੂ.ਦੁ.kang’amaZ.MU.ЭИTesiranNDLwamilawuᱥᱮᱛᱟᱜprije podnemakeoꎸꄑdo połedniŏصبح، منجهندसुबुह जाපෙ.ව.MunkyoGHHosengⵜⵉⴼⴰⵡⵜfmam Vormittag܏ܩܛ\x200ctifawtLuma lwa KSubbaahiTaparachuก่อนเที่ยงསྔ་དྲོ་ቅ.ቀ.hengihengiÖÖgünortadan öňдпچۈشتىن بۇرۇنТОSAybkiɛmɛ́ɛmפֿאַרמיטאָגÀárọ̀Àárɔ̀banhaetतडकेसबेरेpi open sunoʊshilè kʊboɖuभ्यागाए एमଏ ଏମఎ ఎమ్ᐁᒼ"
                        + pQVar1->m_anteMeridiem_idx),size);
  }
LAB_00315e52:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::amText() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res = systemLocale()->query(QSystemLocale::AMText).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    return d->m_data->anteMeridiem().getData(am_data);
}